

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLReader.cc
# Opt level: O1

void OpenMesh::IO::trimStdString(string *_string)

{
  long lVar1;
  long lVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)_string,0x1a56fd,0);
  lVar2 = std::__cxx11::string::find_last_not_of((char *)_string,0x1a56fd,0xffffffffffffffff);
  if (lVar1 == -1 || lVar2 == -1) {
    std::__cxx11::string::_M_replace((ulong)_string,0,(char *)_string->_M_string_length,0x19d3c1);
    return;
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)_string);
  std::__cxx11::string::operator=((string *)_string,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

void trimStdString( std::string& _string) {
  // Trim Both leading and trailing spaces

  size_t start = _string.find_first_not_of(" \t\r\n");
  size_t end   = _string.find_last_not_of(" \t\r\n");

  if(( std::string::npos == start ) || ( std::string::npos == end))
    _string = "";
  else
    _string = _string.substr( start, end-start+1 );
}